

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

int64_t CLI::detail::to_flag_value(string *val)

{
  byte bVar1;
  size_t sVar2;
  __type _Var3;
  int iVar4;
  long lVar5;
  invalid_argument *this;
  pointer __s1;
  long *local_68;
  long local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  long *local_48;
  long local_40;
  long local_38;
  undefined8 uStack_30;
  
  if ((to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_),
     iVar4 != 0)) {
    to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_._M_dataplus._M_p =
         (pointer)&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,"true","");
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_);
  }
  if ((to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_),
     iVar4 != 0)) {
    to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_._M_dataplus._M_p =
         (pointer)&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,"false","");
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
  }
  sVar2 = val->_M_string_length;
  if (sVar2 == to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_._M_string_length) {
    if (sVar2 == 0) {
      return 1;
    }
    iVar4 = bcmp((val->_M_dataplus)._M_p,
                 to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_._M_dataplus._M_p,sVar2);
    if (iVar4 == 0) {
      return 1;
    }
  }
  if (sVar2 == to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_._M_string_length) {
    if (sVar2 == 0) {
      return -1;
    }
    __s1 = (val->_M_dataplus)._M_p;
    iVar4 = bcmp(__s1,to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_._M_dataplus._M_p,
                 sVar2);
    if (iVar4 == 0) {
      return -1;
    }
  }
  else {
    __s1 = (val->_M_dataplus)._M_p;
  }
  local_68 = (long *)&local_58;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_68,__s1,__s1 + sVar2);
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
            (local_68,(undefined1 *)(local_60 + (long)local_68),local_68);
  if (local_68 == (long *)&local_58) {
    uStack_30 = uStack_50;
    local_48 = &local_38;
  }
  else {
    local_48 = local_68;
  }
  local_38 = CONCAT71(uStack_57,local_58);
  local_40 = local_60;
  local_60 = 0;
  local_58 = 0;
  local_68 = (long *)&local_58;
  ::std::__cxx11::string::operator=((string *)val,(string *)&local_48);
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (local_68 != (long *)&local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  sVar2 = val->_M_string_length;
  if (sVar2 == 1) {
    bVar1 = *(val->_M_dataplus)._M_p;
    if ((byte)(bVar1 - 0x31) < 9) {
      lVar5 = (ulong)bVar1 - 0x30;
    }
    else {
      if (bVar1 < 0x66) {
        if (bVar1 != 0x2b) {
          if (bVar1 == 0x2d) {
            return -1;
          }
          if (bVar1 == 0x30) {
            return -1;
          }
          goto LAB_0011a524;
        }
      }
      else {
        if (bVar1 < 0x74) {
          if (bVar1 == 0x66) {
            return -1;
          }
          if (bVar1 == 0x6e) {
            return -1;
          }
LAB_0011a524:
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          ::std::invalid_argument::invalid_argument(this,"unrecognized character");
          __cxa_throw(this,&::std::invalid_argument::typeinfo,
                      ::std::invalid_argument::~invalid_argument);
        }
        if ((bVar1 != 0x79) && (bVar1 != 0x74)) goto LAB_0011a524;
      }
      lVar5 = 1;
    }
  }
  else if ((sVar2 != to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_._M_string_length) ||
          ((lVar5 = 1, sVar2 != 0 &&
           (iVar4 = bcmp((val->_M_dataplus)._M_p,
                         to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_._M_dataplus._M_p
                         ,sVar2), iVar4 != 0)))) {
    iVar4 = ::std::__cxx11::string::compare((char *)val);
    lVar5 = 1;
    if ((iVar4 != 0) &&
       ((iVar4 = ::std::__cxx11::string::compare((char *)val), iVar4 != 0 &&
        (iVar4 = ::std::__cxx11::string::compare((char *)val), iVar4 != 0)))) {
      _Var3 = ::std::operator==(val,&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
      lVar5 = -1;
      if ((!_Var3) &&
         (((iVar4 = ::std::__cxx11::string::compare((char *)val), iVar4 != 0 &&
           (iVar4 = ::std::__cxx11::string::compare((char *)val), iVar4 != 0)) &&
          (iVar4 = ::std::__cxx11::string::compare((char *)val), iVar4 != 0)))) {
        lVar5 = std::__cxx11::stoll(val,(size_t *)0x0,10);
      }
    }
  }
  return lVar5;
}

Assistant:

inline std::int64_t to_flag_value(std::string val) {
    static const std::string trueString("true");
    static const std::string falseString("false");
    if(val == trueString) {
        return 1;
    }
    if(val == falseString) {
        return -1;
    }
    val = detail::to_lower(val);
    std::int64_t ret;
    if(val.size() == 1) {
        if(val[0] >= '1' && val[0] <= '9') {
            return (static_cast<std::int64_t>(val[0]) - '0');
        }
        switch(val[0]) {
        case '0':
        case 'f':
        case 'n':
        case '-':
            ret = -1;
            break;
        case 't':
        case 'y':
        case '+':
            ret = 1;
            break;
        default:
            throw std::invalid_argument("unrecognized character");
        }
        return ret;
    }
    if(val == trueString || val == "on" || val == "yes" || val == "enable") {
        ret = 1;
    } else if(val == falseString || val == "off" || val == "no" || val == "disable") {
        ret = -1;
    } else {
        ret = std::stoll(val);
    }
    return ret;
}